

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner_product_impl.h
# Opt level: O1

int secp256k1_bulletproof_inner_product_real_prove_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scratch *scratch,secp256k1_ge *out_pt,
              size_t *pt_idx,secp256k1_ge *g,secp256k1_ge *geng,secp256k1_ge *genh,
              secp256k1_scalar *a_arr,secp256k1_scalar *b_arr,secp256k1_scalar *yinv,
              secp256k1_scalar *ux,size_t n,uchar *commit)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  ulong n_00;
  int iVar4;
  long lVar5;
  secp256k1_scalar *psVar6;
  secp256k1_scalar *r;
  secp256k1_ge *r_00;
  long lVar7;
  secp256k1_scalar *psVar8;
  ulong n_01;
  secp256k1_scalar *psVar10;
  secp256k1_scalar *r_01;
  ulong uVar11;
  secp256k1_scalar *r_02;
  secp256k1_ge *r_03;
  undefined1 auVar12 [16];
  int overflow;
  secp256k1_ge *local_a30;
  size_t local_a28;
  secp256k1_ge *local_a20;
  secp256k1_scalar *local_a18;
  secp256k1_scalar *local_a10;
  secp256k1_scalar tmps;
  secp256k1_bulletproof_innerproduct_pf_ecmult_context pfdata;
  secp256k1_gej tmprj;
  secp256k1_gej tmplj;
  size_t sVar9;
  
  pfdata.yinv.d[0] = yinv->d[0];
  pfdata.yinv.d[1] = yinv->d[1];
  pfdata.yinv.d[2] = yinv->d[2];
  pfdata.yinv.d[3] = yinv->d[3];
  pfdata.genh = genh;
  pfdata.a = a_arr;
  pfdata.b = b_arr;
  pfdata.n = n;
  if (3 < n) {
    local_a28 = n + 1;
    local_a10 = b_arr + 1;
    local_a18 = a_arr + 1;
    lVar5 = 0;
    sVar9 = n;
    local_a30 = geng;
    local_a20 = g;
    pfdata.geng = geng;
    pfdata.g = g;
    do {
      psVar10 = &pfdata.g_sc;
      n_01 = sVar9 >> 1;
      pfdata.grouping = (size_t)(uint)(1 << ((byte)lVar5 & 0x1f));
      pfdata.g_sc.d[2] = 0;
      pfdata.g_sc.d[3] = 0;
      pfdata.g_sc.d[0] = 0;
      pfdata.g_sc.d[1] = 0;
      psVar6 = a_arr;
      uVar11 = n_01;
      psVar8 = local_a10;
      if (1 < sVar9) {
        do {
          secp256k1_scalar_mul((secp256k1_scalar *)&tmplj,psVar6,psVar8);
          secp256k1_scalar_add(psVar10,psVar10,(secp256k1_scalar *)&tmplj);
          uVar11 = uVar11 - 1;
          psVar6 = psVar6 + 2;
          psVar8 = psVar8 + 2;
        } while (uVar11 != 0);
      }
      secp256k1_scalar_mul(psVar10,psVar10,ux);
      pfdata.yinvn.d[0] = 1;
      pfdata.yinvn.d[1] = 0;
      pfdata.yinvn.d[2] = 0;
      pfdata.yinvn.d[3] = 0;
      secp256k1_ecmult_multi_var
                (ecmult_ctx,scratch,&tmplj,(secp256k1_scalar *)0x0,
                 secp256k1_bulletproof_innerproduct_pf_ecmult_callback_l,&pfdata,local_a28);
      sVar1 = *pt_idx;
      *pt_idx = sVar1 + 1;
      secp256k1_ge_set_gej(out_pt + sVar1,&tmplj);
      pfdata.g_sc.d[2] = 0;
      pfdata.g_sc.d[3] = 0;
      pfdata.g_sc.d[0] = 0;
      pfdata.g_sc.d[1] = 0;
      psVar6 = b_arr;
      uVar11 = n_01;
      psVar8 = local_a18;
      if (1 < sVar9) {
        do {
          secp256k1_scalar_mul((secp256k1_scalar *)&tmprj,psVar8,psVar6);
          secp256k1_scalar_add(psVar10,psVar10,(secp256k1_scalar *)&tmprj);
          uVar11 = uVar11 - 1;
          psVar6 = psVar6 + 2;
          psVar8 = psVar8 + 2;
        } while (uVar11 != 0);
      }
      secp256k1_scalar_mul(psVar10,psVar10,ux);
      pfdata.yinvn.d[0] = 1;
      pfdata.yinvn.d[1] = 0;
      pfdata.yinvn.d[2] = 0;
      pfdata.yinvn.d[3] = 0;
      secp256k1_ecmult_multi_var
                (ecmult_ctx,scratch,&tmprj,(secp256k1_scalar *)0x0,
                 secp256k1_bulletproof_innerproduct_pf_ecmult_callback_r,&pfdata,local_a28);
      sVar1 = *pt_idx;
      *pt_idx = sVar1 + 1;
      secp256k1_ge_set_gej(out_pt + sVar1,&tmprj);
      secp256k1_bulletproof_update_commit(commit,out_pt + (*pt_idx - 2),out_pt + (*pt_idx - 1));
      psVar6 = pfdata.x + lVar5;
      secp256k1_scalar_set_b32(psVar6,commit,&overflow);
      iVar3 = 1;
      if (overflow == 0) {
        auVar12._0_4_ = -(uint)((int)pfdata.x[lVar5].d[2] == 0 && (int)psVar6->d[0] == 0);
        auVar12._4_4_ =
             -(uint)(*(int *)((long)pfdata.x[lVar5].d + 0x14) == 0 &&
                    *(int *)((long)pfdata.x[lVar5].d + 4) == 0);
        auVar12._8_4_ = -(uint)((int)pfdata.x[lVar5].d[3] == 0 && (int)pfdata.x[lVar5].d[1] == 0);
        auVar12._12_4_ =
             -(uint)(*(int *)((long)pfdata.x[lVar5].d + 0x1c) == 0 &&
                    *(int *)((long)pfdata.x[lVar5].d + 0xc) == 0);
        iVar4 = movmskps(1,auVar12);
        iVar3 = 1;
        if (iVar4 != 0xf) {
          r = pfdata.xinv + lVar5;
          secp256k1_scalar_inverse(r,psVar6);
          psVar8 = b_arr;
          psVar10 = a_arr;
          r_01 = b_arr;
          uVar11 = n_01;
          r_02 = a_arr;
          if (1 < sVar9) {
            do {
              secp256k1_scalar_mul(psVar10,psVar10,psVar6);
              secp256k1_scalar_mul(&tmps,psVar10 + 1,r);
              secp256k1_scalar_add(r_02,psVar10,&tmps);
              secp256k1_scalar_mul(r_01,r_01,r);
              secp256k1_scalar_mul(&tmps,r_01 + 1,psVar6);
              secp256k1_scalar_add(psVar8,r_01,&tmps);
              uVar11 = uVar11 - 1;
              psVar8 = psVar8 + 1;
              psVar10 = psVar10 + 2;
              r_01 = r_01 + 2;
              r_02 = r_02 + 1;
            } while (uVar11 != 0);
          }
          if (((0x800 < n && lVar5 == 3) || (0x80 < n && lVar5 == 2)) ||
             (iVar3 = 0, 0x20 < n && lVar5 == 1)) {
            if (1 < sVar9) {
              n_00 = (ulong)(uint)(2 << ((byte)lVar5 & 0x1f));
              r_00 = local_a30;
              uVar11 = n_01;
              r_03 = genh;
              do {
                secp256k1_ecmult_multi_var
                          (ecmult_ctx,scratch,(secp256k1_gej *)&tmps,(secp256k1_scalar *)0x0,
                           secp256k1_bulletproof_innerproduct_pf_ecmult_callback_g,&pfdata,n_00);
                pfdata.geng = pfdata.geng + n_00;
                secp256k1_ge_set_gej(r_00,(secp256k1_gej *)&tmps);
                pfdata.yinvn.d[0] = 1;
                pfdata.yinvn.d[1] = 0;
                pfdata.yinvn.d[2] = 0;
                pfdata.yinvn.d[3] = 0;
                secp256k1_ecmult_multi_var
                          (ecmult_ctx,scratch,(secp256k1_gej *)&tmps,(secp256k1_scalar *)0x0,
                           secp256k1_bulletproof_innerproduct_pf_ecmult_callback_h,&pfdata,n_00);
                pfdata.genh = pfdata.genh + n_00;
                secp256k1_ge_set_gej(r_03,(secp256k1_gej *)&tmps);
                r_03 = r_03 + 1;
                r_00 = r_00 + 1;
                uVar11 = uVar11 - 1;
              } while (uVar11 != 0);
            }
            secp256k1_scalar_sqr(&tmps,yinv);
            for (lVar7 = lVar5; lVar7 != 0; lVar7 = lVar7 + -1) {
              secp256k1_scalar_sqr(&tmps,&tmps);
            }
            iVar3 = secp256k1_bulletproof_inner_product_real_prove_impl
                              (ecmult_ctx,scratch,out_pt,pt_idx,local_a20,local_a30,genh,a_arr,b_arr
                               ,&tmps,ux,n_01,commit);
            iVar3 = 2 - (uint)(iVar3 == 0);
          }
        }
      }
      if (iVar3 != 0) {
        if (iVar3 == 2) {
          return 1;
        }
        return 0;
      }
      lVar5 = lVar5 + 1;
      bVar2 = 7 < sVar9;
      sVar9 = n_01;
    } while (bVar2);
  }
  return 1;
}

Assistant:

static int secp256k1_bulletproof_inner_product_real_prove_impl(const secp256k1_ecmult_context *ecmult_ctx, secp256k1_scratch *scratch, secp256k1_ge *out_pt, size_t *pt_idx, const secp256k1_ge *g, secp256k1_ge *geng, secp256k1_ge *genh, secp256k1_scalar *a_arr, secp256k1_scalar *b_arr, const secp256k1_scalar *yinv, const secp256k1_scalar *ux, const size_t n, unsigned char *commit) {
    size_t i;
    size_t halfwidth;

    secp256k1_bulletproof_innerproduct_pf_ecmult_context pfdata;
    pfdata.yinv = *yinv;
    pfdata.g = g;
    pfdata.geng = geng;
    pfdata.genh = genh;
    pfdata.a = a_arr;
    pfdata.b = b_arr;
    pfdata.n = n;

    /* Protocol 1: Iterate, halving vector size until it is 1 */
    for (halfwidth = n / 2, i = 0; halfwidth > IP_AB_SCALARS / 4; halfwidth /= 2, i++) {
        secp256k1_gej tmplj, tmprj;
        size_t j;
        int overflow;

        pfdata.grouping = 1u << i;

        /* L */
        secp256k1_scalar_clear(&pfdata.g_sc);
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar prod;
            secp256k1_scalar_mul(&prod, &a_arr[2*j], &b_arr[2*j + 1]);
            secp256k1_scalar_add(&pfdata.g_sc, &pfdata.g_sc, &prod);
        }
        secp256k1_scalar_mul(&pfdata.g_sc, &pfdata.g_sc, ux);

        secp256k1_scalar_set_int(&pfdata.yinvn, 1);
        secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &tmplj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_l, (void *) &pfdata, n + 1);
        secp256k1_ge_set_gej(&out_pt[(*pt_idx)++], &tmplj);

        /* R */
        secp256k1_scalar_clear(&pfdata.g_sc);
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar prod;
            secp256k1_scalar_mul(&prod, &a_arr[2*j + 1], &b_arr[2*j]);
            secp256k1_scalar_add(&pfdata.g_sc, &pfdata.g_sc, &prod);
        }
        secp256k1_scalar_mul(&pfdata.g_sc, &pfdata.g_sc, ux);

        secp256k1_scalar_set_int(&pfdata.yinvn, 1);
        secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &tmprj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_r, (void *) &pfdata, n + 1);
        secp256k1_ge_set_gej(&out_pt[(*pt_idx)++], &tmprj);

        /* x, x^2, x^-1, x^-2 */
        secp256k1_bulletproof_update_commit(commit, &out_pt[*pt_idx - 2], &out_pt[*pt_idx] - 1);
        secp256k1_scalar_set_b32(&pfdata.x[i], commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&pfdata.x[i])) {
            return 0;
        }
        secp256k1_scalar_inverse_var(&pfdata.xinv[i], &pfdata.x[i]);

        /* update scalar array */
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar tmps;
            secp256k1_scalar_mul(&a_arr[2*j], &a_arr[2*j], &pfdata.x[i]);
            secp256k1_scalar_mul(&tmps, &a_arr[2*j + 1], &pfdata.xinv[i]);
            secp256k1_scalar_add(&a_arr[j], &a_arr[2*j], &tmps);

            secp256k1_scalar_mul(&b_arr[2*j], &b_arr[2*j], &pfdata.xinv[i]);
            secp256k1_scalar_mul(&tmps, &b_arr[2*j + 1], &pfdata.x[i]);
            secp256k1_scalar_add(&b_arr[j], &b_arr[2*j], &tmps);

        }

        /* Combine G generators and recurse, if that would be more optimal */
        if ((n > 2048 && i == 3) || (n > 128 && i == 2) || (n > 32 && i == 1)) {
            secp256k1_scalar yinv2;

            for (j = 0; j < halfwidth; j++) {
                secp256k1_gej rj;
                secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &rj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_g, (void *) &pfdata, 2u << i);
                pfdata.geng += 2u << i;
                secp256k1_ge_set_gej(&geng[j], &rj);
                secp256k1_scalar_set_int(&pfdata.yinvn, 1);
                secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &rj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_h, (void *) &pfdata, 2u << i);
                pfdata.genh += 2u << i;
                secp256k1_ge_set_gej(&genh[j], &rj);
            }

            secp256k1_scalar_sqr(&yinv2, yinv);
            for (j = 0; j < i; j++) {
                secp256k1_scalar_sqr(&yinv2, &yinv2);
            }
            if (!secp256k1_bulletproof_inner_product_real_prove_impl(ecmult_ctx, scratch, out_pt, pt_idx, g, geng, genh, a_arr, b_arr, &yinv2, ux, halfwidth, commit)) {
                return 0;
            }
            break;
        }
    }
    return 1;
}